

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_status
pugi::impl::anon_unknown_0::load_stream_data_noseek<char>
          (basic_istream<char,_std::char_traits<char>_> *stream,void **out_buffer,size_t *out_size)

{
  xml_stream_chunk<char> *pxVar1;
  byte bVar2;
  xml_stream_chunk<char> *pxVar3;
  size_t sVar4;
  void *pvVar5;
  ulong *in_RDX;
  long *in_RSI;
  char *in_RDI;
  xml_stream_chunk<char> *chunk_1;
  char *write;
  char *buffer;
  size_t max_suffix_size;
  xml_stream_chunk<char> *chunk;
  xml_stream_chunk<char> *last;
  size_t total;
  auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_> chunks;
  undefined5 in_stack_ffffffffffffff60;
  byte in_stack_ffffffffffffff65;
  byte in_stack_ffffffffffffff66;
  byte in_stack_ffffffffffffff67;
  xml_stream_chunk<char> *local_80;
  void *local_78;
  xml_stream_chunk<char> *local_40;
  ulong local_38;
  auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_> local_30;
  ulong *local_20;
  long *local_18;
  char *local_10;
  xml_parse_status local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_>::auto_deleter
            (&local_30,(xml_stream_chunk<char> *)0x0,xml_stream_chunk<char>::destroy);
  local_38 = 0;
  local_40 = (xml_stream_chunk<char> *)0x0;
  do {
    bVar2 = std::ios::eof();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      pvVar5 = (void *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                 ::allocate)(local_38 + 1);
      if (pvVar5 == (void *)0x0) {
        local_4 = status_out_of_memory;
      }
      else {
        local_78 = pvVar5;
        for (local_80 = local_30.data; local_80 != (xml_stream_chunk<char> *)0x0;
            local_80 = local_80->next) {
          memcpy(local_78,local_80->data,local_80->size);
          local_78 = (void *)(local_80->size + (long)local_78);
        }
        *local_18 = (long)pvVar5;
        *local_20 = local_38;
        local_4 = status_ok;
      }
LAB_00147aec:
      auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_>::~auto_deleter
                ((auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff67,
                          CONCAT16(in_stack_ffffffffffffff66,
                                   CONCAT15(in_stack_ffffffffffffff65,in_stack_ffffffffffffff60))));
      return local_4;
    }
    pxVar3 = xml_stream_chunk<char>::create();
    if (pxVar3 == (xml_stream_chunk<char> *)0x0) {
      local_4 = status_out_of_memory;
      goto LAB_00147aec;
    }
    pxVar1 = pxVar3;
    if (local_40 != (xml_stream_chunk<char> *)0x0) {
      local_40->next = pxVar3;
      pxVar1 = local_30.data;
    }
    local_30.data = pxVar1;
    std::istream::read(local_10,(long)pxVar3->data);
    sVar4 = std::istream::gcount();
    pxVar3->size = sVar4;
    in_stack_ffffffffffffff67 = std::ios::bad();
    if (((in_stack_ffffffffffffff67 & 1) != 0) ||
       ((in_stack_ffffffffffffff66 = std::ios::eof(), (in_stack_ffffffffffffff66 & 1) == 0 &&
        (in_stack_ffffffffffffff65 = std::ios::fail(), (in_stack_ffffffffffffff65 & 1) != 0)))) {
      local_4 = status_io_error;
      goto LAB_00147aec;
    }
    if (local_38 + pxVar3->size < local_38) {
      local_4 = status_out_of_memory;
      goto LAB_00147aec;
    }
    local_38 = pxVar3->size + local_38;
    local_40 = pxVar3;
  } while( true );
}

Assistant:

PUGI__FN xml_parse_status load_stream_data_noseek(std::basic_istream<T>& stream, void** out_buffer, size_t* out_size)
	{
		auto_deleter<xml_stream_chunk<T> > chunks(0, xml_stream_chunk<T>::destroy);

		// read file to a chunk list
		size_t total = 0;
		xml_stream_chunk<T>* last = 0;

		while (!stream.eof())
		{
			// allocate new chunk
			xml_stream_chunk<T>* chunk = xml_stream_chunk<T>::create();
			if (!chunk) return status_out_of_memory;

			// append chunk to list
			if (last) last = last->next = chunk;
			else chunks.data = last = chunk;

			// read data to chunk
			stream.read(chunk->data, static_cast<std::streamsize>(sizeof(chunk->data) / sizeof(T)));
			chunk->size = static_cast<size_t>(stream.gcount()) * sizeof(T);

			// read may set failbit | eofbit in case gcount() is less than read length, so check for other I/O errors
			if (stream.bad() || (!stream.eof() && stream.fail())) return status_io_error;

			// guard against huge files (chunk size is small enough to make this overflow check work)
			if (total + chunk->size < total) return status_out_of_memory;
			total += chunk->size;
		}

		size_t max_suffix_size = sizeof(char_t);

		// copy chunk list to a contiguous buffer
		char* buffer = static_cast<char*>(xml_memory::allocate(total + max_suffix_size));
		if (!buffer) return status_out_of_memory;

		char* write = buffer;

		for (xml_stream_chunk<T>* chunk = chunks.data; chunk; chunk = chunk->next)
		{
			assert(write + chunk->size <= buffer + total);
			memcpy(write, chunk->data, chunk->size);
			write += chunk->size;
		}

		assert(write == buffer + total);

		// return buffer
		*out_buffer = buffer;
		*out_size = total;

		return status_ok;
	}